

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * __thiscall QLocale::pmText(QString *__return_storage_ptr__,QLocale *this)

{
  QLocaleData *pQVar1;
  Data *pDVar2;
  QSystemLocale *pQVar3;
  ulong size;
  long in_FS_OFFSET;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  QVariant local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (((this->d).d.ptr)->m_data == &systemLocaleData) {
    (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar3 = systemLocale();
    local_58.shared = (PrivateShared *)0x0;
    local_58._8_8_ = 0;
    local_58._16_8_ = 0;
    local_40 = 2;
    (*pQVar3->_vptr_QSystemLocale[2])(&local_38,pQVar3,0x1c);
    ::QVariant::toString(__return_storage_ptr__,&local_38);
    ::QVariant::~QVariant(&local_38);
    ::QVariant::~QVariant((QVariant *)&local_58);
    if ((__return_storage_ptr__->d).size != 0) goto LAB_0030f5f9;
    pDVar2 = (__return_storage_ptr__->d).d;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((__return_storage_ptr__->d).d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar1 = ((this->d).d.ptr)->m_data;
  size = (ulong)pQVar1->m_postMeridiem_size;
  if (size == 0) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    QString::fromRawData
              ((QChar *)(
                        L"PMnm.a.kEWe pasditesከሰዓትمde la tardeichamthiПМcɛɛ́nkoI ɓugajɔpakasubapamunyiसांझबेलासेpopodneпослије поднеG.M.сл.об.ညနေ下午p.\xa0m.Ḍeffir azaد.نᏒᎯᏱᎢᏗᏢUhr nommendaachsp.m.odp.दपैहर बादebyámuཕྱི་ཆ་UT𐐑𐐣pm𐑐𐑥ptmɣetrɔngəgógəleip.soirkikiiɗe𞤇𞤎SHWANEμ.μ.MogYammadu.e.h.N’abaliep.pos midíi.n.午後Wengin tmedditkooskolinyĨyawĩooپی ایمपी एमHwaĩ-inĩसांजेsanje오후AluulaPNkugúтүштөн кийинкиMUUຫຼັງທ່ຽງpēcpusdienāmpókwapopietwótpołdnjaDiloloOTnomëttesпопл.kyiukonyimchochil’lChiloPTGপি এমƐndámâŨGү.х.ᠦ᠂ ᠬᠣlilliǃuiasअपराह्नncwònzémŋka mbɔ́t njiFọ ívninߥeahketbeaivete.m.TŊWBӕмбисбоны фӕстӕغ.و.بعدازظهرda tardepa pussideinanਬਾ.ਦੁ.kingotoZ.MW.ЭКTeipaLKPashamiheᱧᱤᱫᱟᱹпо поднеpo podnenyiaghuoꁯꋒpo połedniuمنجهند، شامशाम जाප.ව.pop.EiguloGDThapamaⵜⴰⴷⴳⴳⵯⴰⵜemam Namittag܏ܒܛ\x200ctadggʷatluma lwa pZaarikay bEbongiหลังเที่ยงཕྱི་དྲོ་ድ.ቀ.efiafiÖSgünortadan soňппpopołdnjuچۈشتىن كېيىنTKТКCHyhNgokisɛ́ndɛנאָכמיטאָגỌ̀sánƆ̀sánbanringzgvaqसांमpi pini sunoʊshilè kʊsasʊदपेहरा/संजाପି ଏମపి ఎమ్ᐲᒼ"
                        + pQVar1->m_postMeridiem_idx),size);
  }
LAB_0030f5f9:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QLocale::pmText() const
{
#ifndef QT_NO_SYSTEMLOCALE
    if (d->m_data == &systemLocaleData) {
        auto res = systemLocale()->query(QSystemLocale::PMText).toString();
        if (!res.isEmpty())
            return res;
    }
#endif
    return d->m_data->postMeridiem().getData(pm_data);
}